

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>_>_>
::Read(NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>_>_>
       *this,BinaryReader<mp::internal::IdentityConverter> *bound_reader)

{
  StringRef name_00;
  bool bVar1;
  long in_RSI;
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>_>_>
  *in_RDI;
  int info;
  StringRef name;
  int num_args;
  int type;
  int index_3;
  LinearExprHandler expr_handler;
  int position;
  int num_linear_terms;
  int expr_index;
  NumericExpr expr;
  int obj_type;
  int index_2;
  int index_1;
  int index;
  char c;
  bool read_bounds;
  int in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  BinaryReader<mp::internal::IdentityConverter> *in_stack_fffffffffffffee0;
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>_>_>
  *in_stack_fffffffffffffee8;
  BinaryReader<mp::internal::IdentityConverter> *in_stack_fffffffffffffef0;
  uint in_stack_fffffffffffffef8;
  uint in_stack_fffffffffffffefc;
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>_>_>
  *in_stack_ffffffffffffff00;
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>_>_>
  *in_stack_ffffffffffffff08;
  CStringRef in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  VarBoundHandler<testing::NiceMock<MockNLHandler>_> *in_stack_ffffffffffffff38;
  int info_00;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  BasicCStringRef<char> local_a8;
  BasicCStringRef<char> local_a0;
  BasicCStringRef<char> local_98;
  BasicCStringRef<char> local_90;
  uint local_84;
  char *local_80;
  size_t local_78;
  StringRef local_70;
  int local_5c;
  BasicCStringRef<char> local_58;
  int local_50;
  int local_4c;
  IDType local_48;
  int local_40;
  int local_3c;
  int local_38;
  IDType local_34;
  IDType local_30;
  int local_2c;
  int local_28;
  IDType local_24;
  int local_20;
  IDType local_1c;
  int local_18;
  char local_12;
  byte local_11;
  long local_10;
  
  local_11 = in_RSI == 0;
  in_RDI->num_vars_and_exprs_ =
       (in_RDI->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_vars +
       (in_RDI->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_both +
       (in_RDI->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_cons +
       (in_RDI->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_objs +
       (in_RDI->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_single_cons
       + (in_RDI->header_->super_NLProblemInfo).super_NLProblemInfo_C.
         num_common_exprs_in_single_objs;
  local_10 = in_RSI;
  do {
    local_12 = ReaderBase::ReadChar((ReaderBase *)in_RDI->reader_);
    switch(local_12) {
    case '\0':
      bVar1 = ReaderBase::IsEOF((ReaderBase *)0x238e03);
      if (bVar1) {
        if ((local_11 & 1) != 0) {
          fmt::BasicCStringRef<char>::BasicCStringRef(&local_a0,"segment \'b\' missing");
          BinaryReaderBase::ReportError<>
                    ((BinaryReaderBase *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff10);
        }
        return;
      }
    default:
      in_stack_fffffffffffffee0 = in_RDI->reader_;
      fmt::BasicCStringRef<char>::BasicCStringRef(&local_a8,"invalid segment type");
      BinaryReaderBase::ReportError<>
                ((BinaryReaderBase *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff10);
      break;
    case 'C':
      local_18 = ReadUInt(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
      BinaryReaderBase::ReadTillEndOfLine(&in_RDI->reader_->super_BinaryReaderBase);
      in_stack_ffffffffffffff38 = in_RDI->handler_;
      in_stack_ffffffffffffff44 = local_18;
      local_1c = (IDType)ReadNumericExpr(in_stack_fffffffffffffee8,
                                         SUB81((ulong)in_stack_fffffffffffffee0 >> 0x38,0));
      NLHandler<mp::NullNLHandler<BasicTestExpr<0>_>,_BasicTestExpr<0>_>::OnAlgebraicCon
                ((NLHandler<mp::NullNLHandler<BasicTestExpr<0>_>,_BasicTestExpr<0>_> *)
                 in_stack_fffffffffffffee8,(int)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                 (NumericExpr)(IDType)((ulong)in_stack_fffffffffffffef0 >> 0x20));
      break;
    case 'F':
      local_4c = ReadUInt(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
      local_50 = BinaryReader<mp::internal::IdentityConverter>::ReadUInt(in_stack_fffffffffffffef0);
      if ((local_50 != 0) && (local_50 != 1)) {
        in_stack_ffffffffffffff08 =
             (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>_>_>
              *)in_RDI->reader_;
        fmt::BasicCStringRef<char>::BasicCStringRef(&local_58,"invalid function type");
        BinaryReaderBase::ReportError<>
                  ((BinaryReaderBase *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff10);
      }
      local_5c = BinaryReader<mp::internal::IdentityConverter>::ReadInt<int>
                           (in_stack_fffffffffffffee0);
      local_70 = BinaryReader<mp::internal::IdentityConverter>::ReadName
                           ((BinaryReader<mp::internal::IdentityConverter> *)0x238ba1);
      BinaryReaderBase::ReadTillEndOfLine(&in_RDI->reader_->super_BinaryReaderBase);
      local_80 = local_70.data_;
      local_78 = local_70.size_;
      name_00.data_._4_4_ = in_stack_fffffffffffffefc;
      name_00.data_._0_4_ = in_stack_fffffffffffffef8;
      name_00.size_ = (size_t)in_stack_ffffffffffffff00;
      NLHandler<mp::NullNLHandler<BasicTestExpr<0>_>,_BasicTestExpr<0>_>::OnFunction
                ((NLHandler<mp::NullNLHandler<BasicTestExpr<0>_>,_BasicTestExpr<0>_> *)
                 in_stack_fffffffffffffef0,(int)((ulong)in_stack_fffffffffffffee8 >> 0x20),name_00,
                 (int)in_stack_fffffffffffffee8,(Type)((ulong)in_stack_fffffffffffffee0 >> 0x20));
      break;
    case 'G':
      NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>
      ::
      ReadLinearExpr<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>::ObjHandler>
                (in_stack_ffffffffffffff00);
      break;
    case 'J':
      NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>
      ::
      ReadLinearExpr<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>::AlgebraicConHandler>
                (in_stack_ffffffffffffff00);
      break;
    case 'K':
      ReadColumnSizes<false>(in_stack_ffffffffffffff00);
      break;
    case 'L':
      local_20 = ReadUInt(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
      BinaryReaderBase::ReadTillEndOfLine(&in_RDI->reader_->super_BinaryReaderBase);
      in_stack_ffffffffffffff34 = local_20;
      local_24 = (IDType)ReadLogicalExpr(in_stack_ffffffffffffff08);
      NLHandler<mp::NullNLHandler<BasicTestExpr<0>_>,_BasicTestExpr<0>_>::OnLogicalCon
                ((NLHandler<mp::NullNLHandler<BasicTestExpr<0>_>,_BasicTestExpr<0>_> *)
                 in_stack_fffffffffffffee8,(int)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                 (LogicalExpr)(IDType)((ulong)in_stack_fffffffffffffef0 >> 0x20));
      break;
    case 'O':
      local_28 = ReadUInt(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
      local_2c = BinaryReader<mp::internal::IdentityConverter>::ReadUInt(in_stack_fffffffffffffef0);
      BinaryReaderBase::ReadTillEndOfLine(&in_RDI->reader_->super_BinaryReaderBase);
      local_30 = (IDType)ReadNumericExpr(in_stack_fffffffffffffee8,
                                         SUB81((ulong)in_stack_fffffffffffffee0 >> 0x38,0));
      bVar1 = NLHandler<mp::NullNLHandler<BasicTestExpr<0>_>,_BasicTestExpr<0>_>::NeedObj
                        ((NLHandler<mp::NullNLHandler<BasicTestExpr<0>_>,_BasicTestExpr<0>_> *)
                         in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
      if (bVar1) {
        NLHandler<mp::NullNLHandler<BasicTestExpr<0>_>,_BasicTestExpr<0>_>::resulting_obj_index
                  ((NLHandler<mp::NullNLHandler<BasicTestExpr<0>_>,_BasicTestExpr<0>_> *)
                   in_RDI->handler_,local_28);
        local_34 = local_30;
        NLHandler<mp::NullNLHandler<BasicTestExpr<0>_>,_BasicTestExpr<0>_>::OnObj
                  ((NLHandler<mp::NullNLHandler<BasicTestExpr<0>_>,_BasicTestExpr<0>_> *)
                   in_stack_fffffffffffffee8,(int)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                   (Type)in_stack_fffffffffffffee0,
                   (NumericExpr)(IDType)((ulong)in_stack_fffffffffffffef0 >> 0x20));
      }
      break;
    case 'S':
      local_84 = BinaryReader<mp::internal::IdentityConverter>::ReadUInt(in_stack_fffffffffffffef0);
      if (7 < (int)local_84) {
        in_stack_ffffffffffffff00 =
             (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>_>_>
              *)in_RDI->reader_;
        fmt::BasicCStringRef<char>::BasicCStringRef(&local_90,"invalid suffix kind");
        BinaryReaderBase::ReportError<>
                  ((BinaryReaderBase *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff10);
      }
      in_stack_fffffffffffffef8 = local_84 & 3;
      in_stack_fffffffffffffefc = 0;
      info_00 = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
      switch(in_stack_fffffffffffffef8) {
      case 0:
        NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>
        ::
        ReadSuffix<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>::VarHandler>
                  ((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>_>_>
                    *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),info_00);
        break;
      case 1:
        NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>
        ::
        ReadSuffix<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>::ConHandler>
                  ((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>_>_>
                    *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),info_00);
        break;
      case 2:
        NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>
        ::
        ReadSuffix<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>::ObjHandler>
                  ((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>_>_>
                    *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),info_00);
        break;
      case 3:
        NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>
        ::
        ReadSuffix<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>::ProblemHandler>
                  ((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>_>_>
                    *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),info_00);
      }
      break;
    case 'V':
      local_38 = ReadUInt(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
                          in_stack_fffffffffffffef8);
      local_38 = local_38 - (in_RDI->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_vars;
      local_3c = BinaryReader<mp::internal::IdentityConverter>::ReadUInt(in_stack_fffffffffffffef0);
      local_40 = BinaryReader<mp::internal::IdentityConverter>::ReadUInt(in_stack_fffffffffffffef0);
      BinaryReaderBase::ReadTillEndOfLine(&in_RDI->reader_->super_BinaryReaderBase);
      NLHandler<mp::NullNLHandler<BasicTestExpr<0>_>,_BasicTestExpr<0>_>::BeginCommonExpr
                ((NLHandler<mp::NullNLHandler<BasicTestExpr<0>_>,_BasicTestExpr<0>_> *)
                 in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,in_stack_fffffffffffffed8);
      if (local_3c != 0) {
        NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>
        ::
        ReadLinearExpr<mp::NLHandler<mp::NullNLHandler<BasicTestExpr<0>>,BasicTestExpr<0>>::LinearExprHandler>
                  (in_RDI,local_3c);
      }
      in_stack_ffffffffffffff10.data_ = (char *)in_RDI->handler_;
      local_48 = (IDType)ReadNumericExpr(in_stack_fffffffffffffee8,
                                         SUB81((ulong)in_stack_fffffffffffffee0 >> 0x38,0));
      NLHandler<mp::NullNLHandler<BasicTestExpr<0>_>,_BasicTestExpr<0>_>::EndCommonExpr
                ((NLHandler<mp::NullNLHandler<BasicTestExpr<0>_>,_BasicTestExpr<0>_> *)
                 in_stack_fffffffffffffee8,(int)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                 (NumericExpr)(IDType)((ulong)in_stack_fffffffffffffef0 >> 0x20),
                 (int)in_stack_fffffffffffffee0);
      break;
    case 'b':
      if ((local_11 & 1) == 0) {
        if (local_10 == 0) {
          in_stack_fffffffffffffef0 = in_RDI->reader_;
          fmt::BasicCStringRef<char>::BasicCStringRef(&local_98,"duplicate \'b\' segment");
          BinaryReaderBase::ReportError<>
                    ((BinaryReaderBase *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff10);
        }
        BinaryReader<mp::internal::IdentityConverter>::operator=
                  (in_stack_fffffffffffffee0,
                   (BinaryReader<mp::internal::IdentityConverter> *)
                   CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
        local_10 = 0;
      }
      else {
        NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>
        ::
        ReadBounds<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>::VarHandler>
                  ((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>_>_>
                    *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
        ReaderBase::ptr((ReaderBase *)in_RDI->reader_);
        if ((in_RDI->flags_ & 1U) != 0) {
          return;
        }
        local_11 = 0;
      }
      break;
    case 'd':
      NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>
      ::
      ReadInitialValues<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>::AlgebraicConHandler>
                ((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>_>_>
                  *)in_stack_ffffffffffffff10.data_);
      break;
    case 'k':
      ReadColumnSizes<true>
                ((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>_>_>
                  *)in_stack_ffffffffffffff10.data_);
      break;
    case 'r':
      NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>
      ::
      ReadBounds<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>::AlgebraicConHandler>
                (in_RDI);
      break;
    case 'x':
      NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>
      ::
      ReadInitialValues<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>::VarHandler>
                ((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>_>_>
                  *)in_stack_ffffffffffffff10.data_);
    }
  } while( true );
}

Assistant:

void NLReader<Reader, Handler>::Read(Reader *bound_reader) {
  bool read_bounds = bound_reader == 0;
  // TextReader::ReadHeader checks that this doesn't overflow.
  num_vars_and_exprs_ = header_.num_vars +
      header_.num_common_exprs_in_both +
      header_.num_common_exprs_in_cons +
      header_.num_common_exprs_in_objs +
      header_.num_common_exprs_in_single_cons +
      header_.num_common_exprs_in_single_objs;
  for (;;) {
    char c = reader_.ReadChar();
    switch (c) {
    case 'C': {
      // Nonlinear part of an algebraic constraint body.
      int index = ReadUInt(header_.num_algebraic_cons);
      reader_.ReadTillEndOfLine();
      handler_.OnAlgebraicCon(index, ReadNumericExpr(true));
      break;
    }
    case 'L': {
      // Logical constraint expression.
      int index = ReadUInt(header_.num_logical_cons);
      reader_.ReadTillEndOfLine();
      handler_.OnLogicalCon(index, ReadLogicalExpr());
      break;
    }
    case 'O': {
      // Objective type and nonlinear part of an objective expression.
      int index = ReadUInt(header_.num_objs);
      int obj_type = reader_.ReadUInt();
      reader_.ReadTillEndOfLine();
      NumericExpr expr = ReadNumericExpr(true);
      if (handler_.NeedObj(index))
        handler_.OnObj(handler_.resulting_obj_index(index),
                       obj_type != 0 ? obj::MAX : obj::MIN,
                       expr);
      break;
    }
    case 'V': {
      // Defined variable definition (must precede V, C, L, O segments
      // where used).
      int expr_index = ReadUInt(header_.num_vars, num_vars_and_exprs_);
      expr_index -= header_.num_vars;
      int num_linear_terms = reader_.ReadUInt();
      int position = reader_.ReadUInt();
      reader_.ReadTillEndOfLine();
      typename Handler::LinearExprHandler
          expr_handler(handler_.BeginCommonExpr(expr_index, num_linear_terms));
      if (num_linear_terms != 0)
        ReadLinearExpr(num_linear_terms, expr_handler);
      handler_.EndCommonExpr(expr_index, ReadNumericExpr(), position);
      break;
    }
    case 'F': {
      // Imported function description.
      int index = ReadUInt(header_.num_funcs);
      int type = reader_.ReadUInt();
      if (type != func::NUMERIC && type != func::SYMBOLIC)
        reader_.ReportError("invalid function type");
      int num_args = reader_.template ReadInt<int>();
      fmt::StringRef name = reader_.ReadName();
      reader_.ReadTillEndOfLine();
      handler_.OnFunction(index, name, num_args, static_cast<func::Type>(type));
      break;
    }
    case 'G':
      // Linear part of an objective expression & gradient sparsity.
      ReadLinearExpr<ObjHandler>();
      break;
    case 'J':
      // Jacobian sparsity & linear terms in constraints.
      ReadLinearExpr<AlgebraicConHandler>();
      break;
    case 'S': {
      // Suffix values.
      int info = reader_.ReadUInt();
      if (info > (internal::SUFFIX_KIND_MASK | suf::FLOAT))
        reader_.ReportError("invalid suffix kind");
      switch (info & internal::SUFFIX_KIND_MASK) {
      case suf::VAR:
        ReadSuffix<VarHandler>(info);
        break;
      case suf::CON:
        ReadSuffix<ConHandler>(info);
        break;
      case suf::OBJ:
        ReadSuffix<ObjHandler>(info);
        break;
      case suf::PROBLEM:
        ReadSuffix<ProblemHandler>(info);
        break;
      }
      break;
    }
    case 'b':
      // Bounds on variables.
      if (read_bounds) {
        ReadBounds<VarHandler>();
        reader_.ptr();
        if ((flags_ & READ_BOUNDS_FIRST) != 0)
          return;
        read_bounds = false;
        break;
      }
      if (!bound_reader)
        reader_.ReportError("duplicate 'b' segment");
      reader_ = *bound_reader;
      bound_reader = 0;
      break;
    case 'r':
      // Bounds on algebraic constraint bodies ("ranges").
      ReadBounds<AlgebraicConHandler>();
      break;
    case 'K':
      // Jacobian sparsity & linear constraint term matrix column sizes
      // (must precede all J segments).
      ReadColumnSizes<false>();
      break;
    case 'k':
      // Jacobian sparsity & linear constraint term matrix cumulative column
      // sizes (must precede all J segments).
      ReadColumnSizes<true>();
      break;
    case 'x':
      // Primal initial guess.
      ReadInitialValues<VarHandler>();
      break;
    case 'd':
      // Dual initial guess.
      ReadInitialValues<AlgebraicConHandler>();
      break;
    case '\0':
      if (reader_.IsEOF()) {
        if (read_bounds)
          reader_.ReportError("segment 'b' missing");
        return;
      }
      // Fall through.
    default:
      reader_.ReportError("invalid segment type");
    }
  }
}